

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void signal_decoding_done_for_erroneous_row(AV1Decoder *pbi,MACROBLOCKD *xd)

{
  int r;
  int c;
  int *in_RSI;
  long in_RDI;
  AV1DecRowMTSync *dec_row_mt_sync;
  TileDataDec *tile_data;
  int sb_cols_in_tile;
  int sb_row_in_tile;
  TileInfo *tile;
  AV1_COMMON *cm;
  AV1DecRowMTSync *dec_row_mt_sync_00;
  
  dec_row_mt_sync_00 = (AV1DecRowMTSync *)(in_RSI + 0x7a8);
  r = *in_RSI - *(int *)&dec_row_mt_sync_00->mutex_ >>
      ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x9be8) + 0x24) & 0x1f);
  c = av1_get_sb_cols_in_tile((AV1_COMMON *)(in_RDI + 0x3b60),(TileInfo *)dec_row_mt_sync_00);
  sync_write(dec_row_mt_sync_00,r,c,
             (int)((ulong)(*(long *)(in_RDI + 0x48d20) +
                           (long)(dec_row_mt_sync_00->allocated_sb_rows * *(int *)(in_RDI + 0x9c00))
                           * 0x53a0 + (long)*(int *)&dec_row_mt_sync_00->field_0x14 * 0x53a0) >>
                  0x20));
  return;
}

Assistant:

static inline void signal_decoding_done_for_erroneous_row(
    AV1Decoder *const pbi, const MACROBLOCKD *const xd) {
  AV1_COMMON *const cm = &pbi->common;
  const TileInfo *const tile = &xd->tile;
  const int sb_row_in_tile =
      ((xd->mi_row - tile->mi_row_start) >> cm->seq_params->mib_size_log2);
  const int sb_cols_in_tile = av1_get_sb_cols_in_tile(cm, tile);
  TileDataDec *const tile_data =
      pbi->tile_data + tile->tile_row * cm->tiles.cols + tile->tile_col;
  AV1DecRowMTSync *dec_row_mt_sync = &tile_data->dec_row_mt_sync;

  sync_write(dec_row_mt_sync, sb_row_in_tile, sb_cols_in_tile - 1,
             sb_cols_in_tile);
}